

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_TEXM3X3VSPEC(Context *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  RegisterList *item;
  RegisterList *pRVar4;
  uint uVar5;
  uint uVar6;
  size_t buflen;
  char *pcVar7;
  char *pcVar8;
  char dst [64];
  char tmp3 [64];
  char tmp2 [64];
  char tmp [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char *local_280;
  char local_278 [64];
  char local_238 [64];
  char local_1f8 [64];
  char local_1b8 [64];
  char local_178 [64];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  if (ctx->texm3x3pad_src1 != -1) {
    uVar1 = (ctx->dest_arg).regnum;
    iVar2 = ctx->scratch_registers;
    iVar3 = iVar2 + 1;
    ctx->scratch_registers = iVar3;
    if (ctx->max_scratch_registers <= iVar2) {
      ctx->max_scratch_registers = iVar3;
    }
    snprintf(local_1b8,0x40,"scratch%d");
    iVar2 = ctx->scratch_registers;
    iVar3 = iVar2 + 1;
    ctx->scratch_registers = iVar3;
    if (ctx->max_scratch_registers <= iVar2) {
      ctx->max_scratch_registers = iVar3;
    }
    snprintf(local_1f8,0x40,"scratch%d");
    iVar2 = ctx->scratch_registers;
    iVar3 = iVar2 + 1;
    ctx->scratch_registers = iVar3;
    if (ctx->max_scratch_registers <= iVar2) {
      ctx->max_scratch_registers = iVar3;
    }
    snprintf(local_238,0x40,"scratch%d");
    pcVar8 = "t";
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_278,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst0);
    snprintf(local_78,0x40,"%s%s",pcVar7,local_278);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_278,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src0);
    snprintf(local_b8,0x40,"%s%s",pcVar7,local_278);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_278,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst1);
    snprintf(local_f8,0x40,"%s%s",pcVar7,local_278);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_278,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src1);
    snprintf(local_138,0x40,"%s%s",pcVar7,local_278);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar8 = "a";
    }
    snprintf(local_278,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(local_178,0x40,"%s%s",pcVar8,local_278);
    get_ARB1_destarg_varname(ctx,local_278,buflen);
    pRVar4 = (ctx->samplers).next;
    if (pRVar4 != (RegisterList *)0x0) {
      uVar5 = uVar1 | 0xa0000;
      do {
        uVar6 = pRVar4->regtype << 0x10 | pRVar4->regnum;
        if (uVar5 == uVar6) {
          local_280 = "3D";
          if (pRVar4->index == 3) {
            local_280 = "CUBE";
          }
          goto LAB_0011d59c;
        }
      } while ((uVar6 <= uVar5) && (pRVar4 = pRVar4->next, pRVar4 != (RegisterList *)0x0));
    }
    local_280 = "3D";
LAB_0011d59c:
    output_line(ctx,"MOV %s.x, %s.w;",local_238,local_78);
    output_line(ctx,"MOV %s.y, %s.w;",local_238,local_f8);
    output_line(ctx,"MOV %s.z, %s.w;",local_238,local_278);
    output_line(ctx,"DP3 %s.z, %s, %s;",local_278,local_278,local_178);
    output_line(ctx,"DP3 %s.x, %s, %s;",local_278,local_78,local_b8);
    output_line(ctx,"DP3 %s.y, %s, %s;",local_278,local_f8,local_138);
    output_line(ctx,"MUL %s, %s, %s;",local_1b8,local_278,local_278);
    output_line(ctx,"MUL %s, %s, %s;",local_1f8,local_278,local_238);
    output_line(ctx,"RCP %s.x, %s.x;",local_1f8,local_1f8);
    output_line(ctx,"RCP %s.y, %s.y;",local_1f8,local_1f8);
    output_line(ctx,"RCP %s.z, %s.z;",local_1f8,local_1f8);
    output_line(ctx,"RCP %s.w, %s.w;",local_1f8,local_1f8);
    output_line(ctx,"MUL %s, %s, %s;",local_1b8,local_1b8,local_1f8);
    output_line(ctx,"MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };",local_1b8,local_1b8);
    output_line(ctx,"MAD %s, %s, %s, -%s;",local_1b8,local_1b8,local_278,local_238);
    output_line(ctx,"TEX %s, %s, texture[%d], %s;",local_278,local_1b8,(ulong)uVar1,local_280);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X3VSPEC(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char tmp[64];
    char tmp2[64];
    char tmp3[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    allocate_ARB1_scratch_reg_name(ctx, tmp, sizeof (tmp));
    allocate_ARB1_scratch_reg_name(ctx, tmp2, sizeof (tmp2));
    allocate_ARB1_scratch_reg_name(ctx, tmp3, sizeof (tmp3));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, stage);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "CUBE" : "3D";

    output_line(ctx, "MOV %s.x, %s.w;", tmp3, src0);
    output_line(ctx, "MOV %s.y, %s.w;", tmp3, src2);
    output_line(ctx, "MOV %s.z, %s.w;", tmp3, dst);
    output_line(ctx, "DP3 %s.z, %s, %s;", dst, dst, src4);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, src3);
    output_line(ctx, "MUL %s, %s, %s;", tmp, dst, dst);    // normal * normal
    output_line(ctx, "MUL %s, %s, %s;", tmp2, dst, tmp3);  // normal * eyeray

    // !!! FIXME: This is goofy. There's got to be a way to do vector-wide
    // !!! FIXME:  divides or reciprocals...right?
    output_line(ctx, "RCP %s.x, %s.x;", tmp2, tmp2);
    output_line(ctx, "RCP %s.y, %s.y;", tmp2, tmp2);
    output_line(ctx, "RCP %s.z, %s.z;", tmp2, tmp2);
    output_line(ctx, "RCP %s.w, %s.w;", tmp2, tmp2);
    output_line(ctx, "MUL %s, %s, %s;", tmp, tmp, tmp2);

    output_line(ctx, "MUL %s, %s, { 2.0, 2.0, 2.0, 2.0 };", tmp, tmp);
    output_line(ctx, "MAD %s, %s, %s, -%s;", tmp, tmp, dst, tmp3);
    output_line(ctx, "TEX %s, %s, texture[%d], %s;", dst, tmp, stage, ttypestr);
    emit_ARB1_dest_modifiers(ctx);
}